

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.hpp
# Opt level: O3

void __thiscall
vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>::LazyResource
          (LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode> *this,
          MovePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *resource)

{
  Resource *pRVar1;
  uint uVar2;
  InternalError *this_00;
  ulong uVar3;
  
  pRVar1 = (resource->super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>).m_data.
           ptr;
  (resource->super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>).m_data.ptr =
       (Resource *)0x0;
  (this->m_resource).super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.m_data.ptr
       = pRVar1;
  (this->m_isPageResident).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->m_isPageResident).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->m_isPageResident).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (this->m_elements).
  super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_elements).
  super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_elements).
  super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_isPageResident).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->m_isPageResident).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  uVar2 = (*pRVar1->_vptr_Resource[3])();
  uVar3 = (ulong)(int)uVar2;
  if ((uVar3 & 7) == 0) {
    std::
    vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
    ::resize(&this->m_elements,uVar3 >> 3);
    std::vector<bool,_std::allocator<bool>_>::resize
              (&this->m_isPageResident,((uVar3 >> 0xd) + 1) - (ulong)((uVar2 & 0x1ff8) == 0),false);
    return;
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this_00,(char *)0x0,"numElements*sizeof(Element) == resSize",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkBinaryRegistry.hpp"
             ,0x87);
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

LazyResource<Element>::LazyResource (de::MovePtr<tcu::Resource> resource)
	: m_resource(resource)
{
	const size_t	resSize		= m_resource->getSize();
	const size_t	numElements	= resSize/sizeof(Element);
	const size_t	numPages	= (numElements >> ELEMENTS_PER_PAGE_LOG2) + ((numElements & ((1u<<ELEMENTS_PER_PAGE_LOG2)-1u)) == 0 ? 0 : 1);

	TCU_CHECK_INTERNAL(numElements*sizeof(Element) == resSize);

	m_elements.resize(numElements);
	m_isPageResident.resize(numPages, false);
}